

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

CTcMakePath * __thiscall CTcMake::add_sys_include_path(CTcMake *this,textchar_t *path)

{
  CTcMakePath *nxt;
  CTcMakePath *in_RSI;
  long in_RDI;
  CTcMakePath *inc;
  textchar_t *in_stack_ffffffffffffffe8;
  
  nxt = (CTcMakePath *)operator_new(0x10);
  CTcMakePath::CTcMakePath(in_RSI,in_stack_ffffffffffffffe8);
  if (*(long *)(in_RDI + 0x60) == 0) {
    *(CTcMakePath **)(in_RDI + 0x58) = nxt;
  }
  else {
    CTcMakePath::set_next(*(CTcMakePath **)(in_RDI + 0x60),nxt);
  }
  *(CTcMakePath **)(in_RDI + 0x60) = nxt;
  CTcMakePath::set_next(nxt,(CTcMakePath *)0x0);
  return nxt;
}

Assistant:

CTcMakePath *CTcMake::add_sys_include_path(const textchar_t *path)
{
    CTcMakePath *inc;

    /* create the entry */
    inc = new CTcMakePath(path);

    /* add it at the end of our list */
    if (inc_tail_ != 0)
        inc_tail_->set_next(inc);
    else
        inc_head_ = inc;
    inc_tail_ = inc;
    inc->set_next(0);

    /* return the new path object */
    return inc;
}